

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  __type _Var1;
  int iVar2;
  char *pcVar3;
  string *this;
  ostream *poVar4;
  rep rVar5;
  pointer ppVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar7;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f258;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f250;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f248;
  duration<long,_std::ratio<1L,_1000000L>_> dStack_7f240;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f238;
  duration<long,_std::ratio<1L,_1000L>_> dStack_7f230;
  rep rStack_7f228;
  string asStack_7f220 [8];
  string retValue;
  string retKey;
  iterator kvPair;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f1d0;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f1c8;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f1c0;
  duration<long,_std::ratio<1L,_1000000L>_> dStack_7f1b8;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f1b0;
  duration<long,_std::ratio<1L,_1000L>_> dStack_7f1a8;
  rep rStack_7f1a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Stack_7f198;
  undefined1 uStack_7f190;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  pStack_7f188;
  allocator<char> aStack_7f141;
  string asStack_7f140 [36];
  int iStack_7f11c;
  duration dStack_7f118;
  int idx_2;
  allocator<char> aStack_7f109;
  undefined1 auStack_7f108 [8];
  string randomValue;
  string key;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  keyValueStore;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f088;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f080;
  duration<long,_std::ratio<1L,_1000000L>_> dStack_7f078;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f070;
  duration<long,_std::ratio<1L,_1000L>_> dStack_7f068;
  rep rStack_7f060;
  rep rStack_7f058;
  string asStack_7f050 [8];
  string retrieved;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f028;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f020;
  duration<long,_std::ratio<1L,_1000000L>_> dStack_7f018;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7f010;
  duration<long,_std::ratio<1L,_1000L>_> dStack_7f008;
  rep rStack_7f000;
  int iStack_7eff8;
  int iStack_7eff4;
  int idx_1;
  int retrievedIdx;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7efe8;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7efe0;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7efd8;
  duration<long,_std::ratio<1L,_1000000L>_> dStack_7efd0;
  duration<long,_std::ratio<1L,_1000000000L>_> dStack_7efc8;
  duration<long,_std::ratio<1L,_1000L>_> dStack_7efc0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_7efb8;
  time_point end;
  int iStack_7ef9c;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tStack_7ef98;
  int idx;
  time_point begin;
  string *psStack_7ef88;
  int ci;
  string *stringPtrArray [65000];
  string chosenString;
  unsigned_short chosen;
  int storeSize;
  int bufferLength;
  char *buffer;
  
  std::__cxx11::string::string((string *)(stringPtrArray + 64999));
  begin.__d.__r._4_4_ = 0;
  tStack_7ef98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  for (iStack_7ef9c = 0; iStack_7ef9c < 65000; iStack_7ef9c = iStack_7ef9c + 1) {
    pcVar3 = (char *)operator_new__(0x21);
    for (begin.__d.__r._4_4_ = 0; begin.__d.__r._4_4_ < 0x20;
        begin.__d.__r._4_4_ = begin.__d.__r._4_4_ + 1) {
      iVar2 = rand();
      pcVar3[begin.__d.__r._4_4_] = (char)(iVar2 % 0x1a) + 'a';
    }
    pcVar3[0x20] = '\0';
    this = (string *)operator_new(0x20);
    end.__d.__r._2_1_ = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,pcVar3,(allocator<char> *)((long)&end.__d.__r + 3));
    end.__d.__r._2_1_ = 0;
    stringPtrArray[(long)iStack_7ef9c + -1] = this;
    std::allocator<char>::~allocator((allocator<char> *)((long)&end.__d.__r + 3));
    if (iStack_7ef9c == 0xbe6f) {
      std::__cxx11::string::operator=
                ((string *)(stringPtrArray + 64999),(string *)stringPtrArray[0xbe6e]);
    }
  }
  tStack_7efb8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  poVar4 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  dStack_7efc8.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
  dStack_7efc0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      (&dStack_7efc8);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&dStack_7efc0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  poVar4 = std::operator<<(poVar4,"[ms]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  dStack_7efd8.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
  dStack_7efd0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                      (&dStack_7efd8);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&dStack_7efd0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  poVar4 = std::operator<<(poVar4,anon_var_dwarf_52d8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Storage: Time difference = ");
  dStack_7efe8.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
  dStack_7efe0.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                      (&dStack_7efe8);
  rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&dStack_7efe0);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
  poVar4 = std::operator<<(poVar4,"[ns]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  _idx_1 = std::chrono::_V2::steady_clock::now();
  iStack_7eff4 = -1;
  iStack_7eff8 = 0;
  tStack_7ef98.__d.__r = (duration)(duration)_idx_1;
  do {
    if (64999 < iStack_7eff8) {
LAB_00102918:
      rStack_7f000 = std::chrono::_V2::steady_clock::now();
      tStack_7efb8.__d.__r = (duration)(duration)rStack_7f000;
      poVar4 = std::operator<<((ostream *)&std::cout,"Value at 0: ");
      poVar4 = std::operator<<(poVar4,psStack_7ef88);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Value at 1: ");
      poVar4 = std::operator<<(poVar4,(string *)stringPtrArray[0]);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieved         : ");
      poVar4 = std::operator<<(poVar4,(string *)(stringPtrArray + 64999));
      poVar4 = std::operator<<(poVar4," at index: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iStack_7eff4);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      dStack_7f010.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f008.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f010);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&dStack_7f008);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ms]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      dStack_7f020.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f018.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f020);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&dStack_7f018);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,anon_var_dwarf_52d8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by name : Time difference = ");
      retrieved.field_2._8_8_ = std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f028.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           ((long)&retrieved.field_2 + 8));
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&dStack_7f028);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ns]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::string(asStack_7f050);
      rStack_7f058 = std::chrono::_V2::steady_clock::now();
      tStack_7ef98.__d.__r = (duration)(duration)rStack_7f058;
      std::__cxx11::string::operator=(asStack_7f050,(string *)stringPtrArray[0xbe6e]);
      rStack_7f060 = std::chrono::_V2::steady_clock::now();
      tStack_7efb8.__d.__r = (duration)(duration)rStack_7f060;
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieved         : ");
      poVar4 = std::operator<<(poVar4,asStack_7f050);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      dStack_7f070.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f068.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f070);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&dStack_7f068);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ms]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      dStack_7f080.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f078.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f080);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&dStack_7f078);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,anon_var_dwarf_52d8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieval by index: Time difference = ");
      keyValueStore._M_h._M_single_bucket =
           (__node_base_ptr)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f088.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           &keyValueStore._M_h._M_single_bucket);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&dStack_7f088);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ns]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)((long)&key.field_2 + 8));
      std::__cxx11::string::string((string *)(randomValue.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)auStack_7f108,"wibble",&aStack_7f109);
      std::allocator<char>::~allocator(&aStack_7f109);
      dStack_7f118.__r = std::chrono::_V2::steady_clock::now();
      tStack_7ef98.__d.__r = (duration)(duration)dStack_7f118.__r;
      for (iStack_7f11c = 0; iStack_7f11c < 65000; iStack_7f11c = iStack_7f11c + 1) {
        pcVar3 = (char *)operator_new__(0x21);
        for (begin.__d.__r._4_4_ = 0; begin.__d.__r._4_4_ < 0x20;
            begin.__d.__r._4_4_ = begin.__d.__r._4_4_ + 1) {
          iVar2 = rand();
          pcVar3[begin.__d.__r._4_4_] = (char)(iVar2 % 0x1a) + 'a';
        }
        pcVar3[0x20] = '\0';
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(asStack_7f140,pcVar3,&aStack_7f141);
        std::__cxx11::string::operator=
                  ((string *)(randomValue.field_2._M_local_buf + 8),asStack_7f140);
        std::__cxx11::string::~string(asStack_7f140);
        std::allocator<char>::~allocator(&aStack_7f141);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                  (&pStack_7f188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (randomValue.field_2._M_local_buf + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_7f108);
        pVar7 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::insert((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&key.field_2 + 8),&pStack_7f188);
        _Stack_7f198._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
             ._M_cur;
        uStack_7f190 = pVar7.second;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(&pStack_7f188);
        if (iStack_7f11c == 0xbe6f) {
          std::__cxx11::string::operator=
                    ((string *)(stringPtrArray + 64999),
                     (string *)(randomValue.field_2._M_local_buf + 8));
        }
      }
      rStack_7f1a0 = std::chrono::_V2::steady_clock::now();
      tStack_7efb8.__d.__r = (duration)(duration)rStack_7f1a0;
      poVar4 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      dStack_7f1b0.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f1a8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f1b0);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&dStack_7f1a8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ms]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      dStack_7f1c0.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f1b8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f1c0);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&dStack_7f1b8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,anon_var_dwarf_52d8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"MapStore: Time difference = ");
      dStack_7f1d0.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f1c8.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f1d0);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&dStack_7f1c8);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ns]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      tStack_7ef98.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      retKey.field_2._8_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)((long)&key.field_2 + 8),(key_type *)(stringPtrArray + 64999));
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)((long)&retKey.field_2 + 8));
      std::__cxx11::string::string((string *)(retValue.field_2._M_local_buf + 8),(string *)ppVar6);
      ppVar6 = std::__detail::
               _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                             *)((long)&retKey.field_2 + 8));
      std::__cxx11::string::string(asStack_7f220,(string *)&ppVar6->second);
      rStack_7f228 = std::chrono::_V2::steady_clock::now();
      tStack_7efb8.__d.__r = (duration)(duration)rStack_7f228;
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieved key    : ");
      poVar4 = std::operator<<(poVar4,(string *)(retValue.field_2._M_local_buf + 8));
      poVar4 = std::operator<<(poVar4," with value: ");
      poVar4 = std::operator<<(poVar4,asStack_7f220);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      dStack_7f238.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f230.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f238);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&dStack_7f230);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ms]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      dStack_7f248.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f240.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f248);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&dStack_7f240);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,anon_var_dwarf_52d8);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      poVar4 = std::operator<<((ostream *)&std::cout,"Retrieve from Map: Time difference = ");
      dStack_7f258.__r = (rep)std::chrono::operator-(&tStack_7efb8,&stack0xfffffffffff81068);
      dStack_7f250.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000000l>>
                          (&dStack_7f258);
      rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&dStack_7f250);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,rVar5);
      poVar4 = std::operator<<(poVar4,"[ns]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(asStack_7f220);
      std::__cxx11::string::~string((string *)(retValue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)auStack_7f108);
      std::__cxx11::string::~string((string *)(randomValue.field_2._M_local_buf + 8));
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&key.field_2 + 8));
      std::__cxx11::string::~string(asStack_7f050);
      std::__cxx11::string::~string((string *)(stringPtrArray + 64999));
      return 0;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (stringPtrArray + 64999),stringPtrArray[(long)iStack_7eff8 + -1]);
    if (_Var1) {
      iStack_7eff4 = iStack_7eff8;
      goto LAB_00102918;
    }
    iStack_7eff8 = iStack_7eff8 + 1;
  } while( true );
}

Assistant:

int main()
{
  // Store 65 000 items in memory of random length
  //  (max 16 letters @ 8 bits per char = 128 bits)
  //  (max 128 letters @ 8 bits per char = 1024 bits)
  // QUIZ: Why not 100 000 above?
  char* buffer;
  int bufferLength = 32;

  const int storeSize = 65000; // Number of records in our 'database'



  // OPTION 1: Store unsorted

  const unsigned short int chosen = (storeSize / 4) * 3 + 1;
  std::string chosenString;
  std::string* stringPtrArray[storeSize]; // array of pointers to strings
  int ci = 0;
  std::chrono::steady_clock::time_point begin = std::chrono::steady_clock::now();

  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    stringPtrArray[idx] = new std::string(buffer);
    if (chosen == idx) {
      chosenString = *stringPtrArray[idx]; // copy constructor
    }
  }
  // Storage time?
  std::chrono::steady_clock::time_point end = std::chrono::steady_clock::now();

  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Storage: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Storage: Time difference = 34[ms]
Storage: Time difference = 34292[µs]
Storage: Time difference = 34292787[ns]
*/





  // OPTION 1a: Retrieve by key name

  // Pull back a random one by name (akin to a search by the key string in a K-V store)
  begin = std::chrono::steady_clock::now();
  int retrievedIdx = -1;
  for (int idx = 0;idx < storeSize;idx++) {
    if (chosenString == *stringPtrArray[idx]) {
      retrievedIdx = idx;
      break; // end loop early
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "Value at 0: " << *stringPtrArray[0] << std::endl;
  std::cout << "Value at 1: " << *stringPtrArray[1] << std::endl;
  std::cout << "Retrieved         : " << chosenString << " at index: " << retrievedIdx << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by name : Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Value at 0: lrfkqyuqfjkxyqvnrtysfrzrmzlygfve
Value at 1: ulqfpdbhlqdqrrcrwdnxeuoqqeklaitg
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq at index: 48751
Retrieval by name : Time difference = 4[ms]
Retrieval by name : Time difference = 4351[µs]
Retrieval by name : Time difference = 4351301[ns]
*/





  // OPTION 1b: Retrieve by known key index (position)

  // Pull back a random one by index, and record the time taken
  std::string retrieved;
  begin = std::chrono::steady_clock::now();
  retrieved = *stringPtrArray[chosen];
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved         : " << retrieved << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieval by index: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved         : oviwymmnaqptldgltxzaoofhohntvctq
Retrieval by index: Time difference = 0[ms]
Retrieval by index: Time difference = 0[µs]
Retrieval by index: Time difference = 935[ns]
*/








  // Solution formulation...

  // QUESTION: What is more performant: Fetch by name, or fetch by index?
  //   ANSWER: Index takes 1/263 of the time! It's *MUCH* faster!
  // QUESTION: If we hash the name and use this hash value as the index, could we improve things?
  //   ANSWER: Probably, yes
  //    QUESTION: Could the calculation of the hash take longer than retrieval of the value by name? What does this imply?
  //      ANSWER: Possibly, if not many keys or key names were all short. This means it will be slower than by name! ;o(









  // OPTION 2: Store by the hash of a key in an efficient (O log(n)) unordered map
  // C++11 reference https://www.cplusplus.com/reference/unordered_map/unordered_map/

  // Now do the same for a hash table variant
  // Hash table -> Convert type (string) to a hash number, store data at hash index, and retrieve by hash index
  // Use built in hash map type in C++ for this
  std::unordered_map<std::string,std::string> keyValueStore;
  std::string key;
  std::string randomValue = "wibble"; // doesn't matter - we're test key speed
  begin = std::chrono::steady_clock::now();
  for (int idx = 0;idx < storeSize;idx++) {
    buffer = new char[bufferLength + 1]; // termination \0
    for (ci = 0;ci < bufferLength;ci++) {
      buffer[ci] = (rand() % 26) + 'a'; // random char from a-z
    }
    buffer[bufferLength] = '\0';
    key = std::string(buffer);
    keyValueStore.insert({key,randomValue}); // C++11, creates a std::pair<string,string>
    if (chosen == idx) {
      chosenString = key; // copy constructor
    }
  }
  end = std::chrono::steady_clock::now();
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "MapStore: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
MapStore: Time difference = 103[ms]
MapStore: Time difference = 103129[µs]
MapStore: Time difference = 103129217[ns]
*/





  // OPTION 2: Retrieval time
  begin = std::chrono::steady_clock::now();
  auto kvPair = keyValueStore.find(chosenString);
  std::string retKey = kvPair->first; // first is key
  std::string retValue = kvPair->second; // second is value
  end = std::chrono::steady_clock::now();
  std::cout << "Retrieved key    : " << retKey << " with value: " << retValue << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count() << "[ms]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::microseconds>(end - begin).count() << "[µs]" << std::endl;
  std::cout << "Retrieve from Map: Time difference = " << std::chrono::duration_cast<std::chrono::nanoseconds> (end - begin).count() << "[ns]" << std::endl;
/*
Retrieved key    : yfuhybliokgniztyfuquvlaleaznpcsr with value: wibble
Retrieve from Map: Time difference = 0[ms]
Retrieve from Map: Time difference = 1[µs]
Retrieve from Map: Time difference = 1236[ns]
*/




  // CONCLUSIONS???

  // QUESTION: How did storage speeds compare amongst the two mechanisms?
  //   ANSWER: Hash method is 3 times slower! 103ms vs 34ms. "I thought you said this would be BETTER to use!?!" (well...)
  // QUESTION: How did retrieval speeds compare against the three mechanisms (fetch by name, by index (pre-computed hash), and by hash)?
  //   ANSWER: name: 4351301ns, index: 935ns, hash: 1249ns
  //           i.e. Retrieval was 1/3483 the time vs by name, but 1.33 times longer than a raw index
  //           BUT raw C++ in memory indexes are the quickest you're going to get - seek to memory location
  //            - You can't guarantee a large chunk of contiguous memory is given to your database server as
  //              most Operating Systems randomise memory locations for security, so you can't use raw memory.
  //           CONCLUSION: Hash based map implementations are insanely quick - we should totally use hashes and in-memory unordered maps
}